

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O3

Error asmjit::v1_14::Formatter::formatFuncArgs
                (String *sb,FormatFlags formatFlags,BaseCompiler *cc,FuncDetail *fd,
                ArgPack *argPacks)

{
  FuncDetail FVar1;
  Error EVar2;
  BaseBuilder *builder;
  FormatOptions *formatOptions;
  String *sb_00;
  ulong uVar3;
  FuncDetail *pack;
  
  FVar1 = fd[0x74];
  if ((ulong)(byte)FVar1 == 0) {
    EVar2 = String::_opString(sb,kAppend,"void",0xffffffffffffffff);
    return EVar2;
  }
  pack = fd + 0x9c;
  uVar3 = 0;
  do {
    if (uVar3 != 0) {
      formatOptions = (FormatOptions *)0x1;
      sb_00 = sb;
      EVar2 = String::_opString(sb,kAppend,", ",0xffffffffffffffff);
      if (EVar2 != 0) {
        return EVar2;
      }
      if (0x1f < uVar3) {
        formatFuncArgs();
        EVar2 = formatNodeList(sb_00,formatOptions,builder,*(BaseNode **)&builder->_nodeList,
                               (BaseNode *)0x0);
        return EVar2;
      }
    }
    EVar2 = formatFuncValuePack(sb,formatFlags,cc,(FuncValuePack *)pack,argPacks->_data);
    if (EVar2 != 0) {
      return EVar2;
    }
    uVar3 = uVar3 + 1;
    argPacks = (ArgPack *)((long)argPacks + 0x20);
    pack = pack + 0x10;
  } while ((byte)FVar1 != uVar3);
  return 0;
}

Assistant:

static Error formatFuncArgs(
  String& sb,
  FormatFlags formatFlags,
  const BaseCompiler* cc,
  const FuncDetail& fd,
  const FuncNode::ArgPack* argPacks) noexcept {

  uint32_t argCount = fd.argCount();
  if (!argCount)
    return sb.append("void");

  for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
    if (argIndex)
      ASMJIT_PROPAGATE(sb.append(", "));

    ASMJIT_PROPAGATE(formatFuncValuePack(sb, formatFlags, cc, fd.argPack(argIndex), argPacks[argIndex]._data));
  }

  return kErrorOk;
}